

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_>::
     init_holder<kratos::InterfaceDefinition>
               (instance *inst,value_and_holder *v_h,holder_type *param_3,
               enable_shared_from_this<kratos::InterfaceDefinition> *param_4)

{
  _Atomic_word *p_Var1;
  byte *pbVar2;
  int iVar3;
  void **ppvVar4;
  instance *piVar5;
  InterfaceDefinition *__p;
  byte bVar6;
  int iVar7;
  undefined8 *puVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  void *pvVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  bool bVar11;
  
  puVar8 = (undefined8 *)((long)*v_h->vh + 8);
  if (*v_h->vh == (void *)0x0) {
    puVar8 = (undefined8 *)0x0;
  }
  pvVar9 = (void *)*puVar8;
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar8[1];
  this = p_Var10;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_weak_count = p_Var10->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_weak_count = p_Var10->_M_weak_count + 1;
    }
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = p_Var10->_M_use_count;
      do {
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar7 == 0) break;
        LOCK();
        iVar3 = p_Var10->_M_use_count;
        bVar11 = iVar7 == iVar3;
        if (bVar11) {
          p_Var10->_M_use_count = iVar7 + 1;
          iVar3 = iVar7;
        }
        iVar7 = iVar3;
        UNLOCK();
        this = p_Var10;
      } while (!bVar11);
    }
  }
  if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pvVar9 = (void *)0x0;
  }
  else if (this->_M_use_count == 0) {
    pvVar9 = (void *)0x0;
  }
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var10->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = p_Var10->_M_weak_count;
      p_Var10->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*p_Var10->_vptr__Sp_counted_base[3])();
    }
  }
  p_Var10 = this;
  if (pvVar9 == (void *)0x0) {
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (pvVar9 != (void *)0x0)) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
      p_Var10 = this;
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
      p_Var10 = this;
    }
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (pvVar9 != (void *)0x0) {
    ppvVar4 = v_h->vh;
    ppvVar4[1] = pvVar9;
    ppvVar4[2] = p_Var10;
    piVar5 = v_h->inst;
    if ((piVar5->field_0x30 & 2) == 0) {
      pbVar2 = (piVar5->field_1).nonsimple.status + v_h->index;
      *pbVar2 = *pbVar2 | 1;
    }
    else {
      piVar5->field_0x30 = piVar5->field_0x30 | 4;
    }
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  bVar6 = v_h->inst->field_0x30;
  if ((bVar6 & 2) == 0) {
    bVar6 = (v_h->inst->field_1).nonsimple.status[v_h->index] & 1;
  }
  else {
    bVar6 = bVar6 & 4;
  }
  if ((bVar6 == 0) && ((inst->field_0x30 & 1) != 0)) {
    ppvVar4 = v_h->vh;
    __p = (InterfaceDefinition *)*ppvVar4;
    ppvVar4[1] = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<kratos::InterfaceDefinition*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ppvVar4 + 2),__p);
    std::__shared_ptr<kratos::InterfaceDefinition,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::InterfaceDefinition,kratos::InterfaceDefinition>
              ((__shared_ptr<kratos::InterfaceDefinition,(__gnu_cxx::_Lock_policy)2> *)(ppvVar4 + 1)
               ,__p);
    piVar5 = v_h->inst;
    if ((piVar5->field_0x30 & 2) == 0) {
      pbVar2 = (piVar5->field_1).nonsimple.status + v_h->index;
      *pbVar2 = *pbVar2 | 1;
    }
    else {
      piVar5->field_0x30 = piVar5->field_0x30 | 4;
    }
  }
  if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type * /* unused */, const std::enable_shared_from_this<T> * /* dummy */) {

        auto sh = std::dynamic_pointer_cast<typename holder_type::element_type>(
                detail::try_get_shared_from_this(v_h.value_ptr<type>()));
        if (sh) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(std::move(sh));
            v_h.set_holder_constructed();
        }

        if (!v_h.holder_constructed() && inst->owned) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }